

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperatorExpressions.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::BinaryExpression::fromComponents
          (BinaryExpression *this,Expression *lhs,Expression *rhs,BinaryOperator op,
          SourceLocation opLoc,SourceRange sourceRange,ASTContext *context)

{
  Compilation *compilation;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  BinaryExpression *expr;
  Compilation *pCVar4;
  Diagnostic *diag;
  Diagnostic *diag_00;
  logic_error *this_00;
  long *plVar5;
  undefined4 in_register_0000000c;
  SourceLocation location;
  Type *this_01;
  long lVar6;
  char *pcVar7;
  size_type *psVar8;
  long *plVar9;
  Type *pTVar10;
  Type *forceType;
  Type *extraout_RDX;
  Type *extraout_RDX_00;
  Compilation *compilation_00;
  BinaryOperator local_104;
  long *local_100;
  long local_f8;
  long local_f0;
  long lStack_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  long *local_c0;
  long local_b8;
  long local_b0;
  long lStack_a8;
  SourceRange local_a0;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  location._4_4_ = in_register_0000000c;
  location._0_4_ = op;
  local_104 = (BinaryOperator)rhs;
  local_a0.startLoc = opLoc;
  local_a0.endLoc = (SourceLocation)context;
  if (*(undefined8 **)sourceRange.startLoc == (undefined8 *)0x0) {
    pcVar7 = 
    "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]";
LAB_003aa48a:
    assert::assertFailed
              ("ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
               ,0x26,pcVar7);
  }
  compilation_00 = (Compilation *)(this->super_Expression).type.ptr;
  if ((compilation_00 == (Compilation *)0x0) || (this_01 = (lhs->type).ptr, this_01 == (Type *)0x0))
  {
    pcVar7 = 
    "T slang::not_null<const slang::ast::Type *>::get() const [T = const slang::ast::Type *]";
    goto LAB_003aa48a;
  }
  compilation = (Compilation *)**(undefined8 **)sourceRange.startLoc;
  expr = BumpAllocator::
         emplace<slang::ast::BinaryExpression,slang::ast::BinaryOperator&,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                   ((BumpAllocator *)compilation,&local_104,(Type *)compilation_00,
                    &this->super_Expression,lhs,&local_a0);
  bVar1 = Expression::bad(&this->super_Expression);
  if ((bVar1) || (bVar1 = Expression::bad(lhs), bVar1)) goto LAB_003aa3d9;
  if ((compilation_00->options).topModules.
      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      .entries == (EntryPointer)0x0) {
    Type::resolveCanonical((Type *)compilation_00);
  }
  if (*(int *)(compilation_00->options).topModules.
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .entries == 0x1b) {
    compilation_00 = (Compilation *)compilation->intType;
  }
  if (this_01->canonical == (Type *)0x0) {
    Type::resolveCanonical(this_01);
  }
  if ((this_01->canonical->super_Symbol).kind == UnboundedType) {
    this_01 = compilation->intType;
  }
  bVar1 = Type::isIntegral((Type *)compilation_00);
  if (bVar1) {
    bVar1 = Type::isIntegral(this_01);
  }
  else {
    bVar1 = false;
  }
  bVar2 = Type::isNumeric((Type *)compilation_00);
  if (bVar2) {
    bVar2 = Type::isNumeric(this_01);
  }
  else {
    bVar2 = false;
  }
  bVar3 = Expression::isImplicitString(&this->super_Expression);
  if (bVar3) {
    bVar3 = Expression::isImplicitString(lhs);
  }
  else {
    bVar3 = false;
  }
  if (0x1b < (ulong)local_104) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/expressions/OperatorExpressions.cpp"
               ,"");
    plVar5 = (long *)std::__cxx11::string::append((char *)local_90);
    local_e0._M_dataplus._M_p = (pointer)*plVar5;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)local_e0._M_dataplus._M_p == psVar8) {
      local_e0.field_2._M_allocated_capacity = *psVar8;
      local_e0.field_2._8_8_ = plVar5[3];
      local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    }
    else {
      local_e0.field_2._M_allocated_capacity = *psVar8;
    }
    local_e0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x322);
    std::operator+(&local_50,&local_e0,&local_70);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_c0 = (long *)*plVar5;
    plVar9 = plVar5 + 2;
    if (local_c0 == plVar9) {
      local_b0 = *plVar9;
      lStack_a8 = plVar5[3];
      local_c0 = &local_b0;
    }
    else {
      local_b0 = *plVar9;
    }
    local_b8 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_c0);
    local_100 = (long *)*plVar5;
    plVar9 = plVar5 + 2;
    if (local_100 == plVar9) {
      local_f0 = *plVar9;
      lStack_e8 = plVar5[3];
      local_100 = &local_f0;
    }
    else {
      local_f0 = *plVar9;
    }
    local_f8 = plVar5[1];
    *plVar5 = (long)plVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_100);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  pTVar10 = (Type *)((long)&switchD_003a9cc0::switchdataD_0041ac1c +
                    (long)(int)(&switchD_003a9cc0::switchdataD_0041ac1c)[local_104]);
  switch(local_104) {
  case Add:
  case Subtract:
  case Multiply:
    bVar1 = false;
    goto LAB_003aa01c;
  case Divide:
    bVar1 = true;
LAB_003aa01c:
    pTVar10 = Expression::binaryOperatorType(compilation,(Type *)compilation_00,this_01,bVar1,false)
    ;
    if (pTVar10 != (Type *)0x0) {
      (expr->super_Expression).type.ptr = pTVar10;
LAB_003aa387:
      if (bVar2 == false) {
        diag = ASTContext::addDiag((ASTContext *)sourceRange.startLoc,(DiagCode)0x1d0007,location);
        diag_00 = ast::operator<<(diag,(Type *)compilation_00);
        ast::operator<<(diag_00,this_01);
        Diagnostic::operator<<(diag,(this->super_Expression).sourceRange);
        Diagnostic::operator<<(diag,lhs->sourceRange);
LAB_003aa3d9:
        expr = (BinaryExpression *)Expression::badExpr(compilation,&expr->super_Expression);
      }
      return &expr->super_Expression;
    }
    break;
  case Mod:
    bVar2 = true;
    goto LAB_003a9ff1;
  case BinaryAnd:
  case BinaryOr:
  case BinaryXor:
  case BinaryXnor:
    bVar2 = false;
LAB_003a9ff1:
    pTVar10 = Expression::binaryOperatorType(compilation,(Type *)compilation_00,this_01,bVar2,false)
    ;
    if (pTVar10 == (Type *)0x0) break;
    (expr->super_Expression).type.ptr = pTVar10;
    bVar2 = bVar1;
    goto LAB_003aa387;
  default:
    if (bVar2 == false) {
      bVar1 = local_104 - LogicalAnd < 0xfffffffe;
      if (bVar3 == false) {
        bVar2 = Type::isAggregate((Type *)compilation_00);
        if ((bVar2) && (bVar2 = Type::isEquivalent((Type *)compilation_00,this_01), bVar2)) {
          if ((compilation_00->options).topModules.
              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
              .entries == (EntryPointer)0x0) {
            Type::resolveCanonical((Type *)compilation_00);
          }
          if (*(int *)(compilation_00->options).topModules.
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .entries != 0x13) {
            bVar2 = Type::isFourState((Type *)compilation_00);
            lVar6 = 0x100;
            if (!bVar2) {
              bVar2 = Type::isFourState(this_01);
              lVar6 = (ulong)bVar2 * 8 + 0xf8;
            }
            pTVar10 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar6);
            if (pTVar10 != (Type *)0x0) {
              (expr->super_Expression).type.ptr = pTVar10;
              goto LAB_003aa350;
            }
            break;
          }
        }
        if ((compilation_00->options).topModules.
            super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .entries == (EntryPointer)0x0) {
          Type::resolveCanonical((Type *)compilation_00);
        }
        if ((*(int *)(compilation_00->options).topModules.
                     super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     .entries != 0x14) ||
           (bVar2 = Type::isAssignmentCompatible((Type *)compilation_00,this_01), !bVar2)) {
          if (this_01->canonical == (Type *)0x0) {
            Type::resolveCanonical(this_01);
          }
          if (((this_01->canonical->super_Symbol).kind != ClassType) ||
             (bVar2 = Type::isAssignmentCompatible(this_01,(Type *)compilation_00), !bVar2)) {
            if ((compilation_00->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries == (EntryPointer)0x0) {
              Type::resolveCanonical((Type *)compilation_00);
            }
            if ((*(int *)(compilation_00->options).topModules.
                         super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                         .entries == 0x18) ||
               (*(int *)(compilation_00->options).topModules.
                        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        .entries == 0x17)) {
              if (this_01->canonical == (Type *)0x0) {
                Type::resolveCanonical(this_01);
              }
              if (((this_01->canonical->super_Symbol).kind != CHandleType) &&
                 ((this_01->canonical->super_Symbol).kind != NullType)) goto LAB_003aa191;
            }
            else {
LAB_003aa191:
              if ((compilation_00->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries == (EntryPointer)0x0) {
                Type::resolveCanonical((Type *)compilation_00);
              }
              if ((*(int *)(compilation_00->options).topModules.
                           super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           .entries == 0x1a) ||
                 (*(int *)(compilation_00->options).topModules.
                          super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          .entries == 0x17)) {
                if (this_01->canonical == (Type *)0x0) {
                  Type::resolveCanonical(this_01);
                }
                if (((this_01->canonical->super_Symbol).kind == EventType) ||
                   ((this_01->canonical->super_Symbol).kind == NullType)) goto LAB_003aa2cd;
              }
              if ((compilation_00->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries == (EntryPointer)0x0) {
                Type::resolveCanonical((Type *)compilation_00);
              }
              if ((*(int *)(compilation_00->options).topModules.
                           super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           .entries == 0x15) ||
                 (*(int *)(compilation_00->options).topModules.
                          super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                          .entries == 0x17)) {
                if (this_01->canonical == (Type *)0x0) {
                  Type::resolveCanonical(this_01);
                }
                if (((this_01->canonical->super_Symbol).kind == CovergroupType) ||
                   ((this_01->canonical->super_Symbol).kind == NullType)) goto LAB_003aa2cd;
              }
              if ((compilation_00->options).topModules.
                  super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  .entries == (EntryPointer)0x0) {
                Type::resolveCanonical((Type *)compilation_00);
              }
              if ((*(int *)(compilation_00->options).topModules.
                           super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                           .entries != 0x20) ||
                 (bVar2 = Type::isAssignmentCompatible((Type *)compilation_00,this_01), !bVar2)) {
                if (this_01->canonical == (Type *)0x0) {
                  Type::resolveCanonical(this_01);
                }
                if (((this_01->canonical->super_Symbol).kind != VirtualInterfaceType) ||
                   (bVar2 = Type::isAssignmentCompatible(this_01,(Type *)compilation_00), !bVar2)) {
                  if ((compilation_00->options).topModules.
                      super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                      .entries == (EntryPointer)0x0) {
                    Type::resolveCanonical((Type *)compilation_00);
                  }
                  if (*(int *)(compilation_00->options).topModules.
                              super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                              .entries == 0x1c) {
                    if (this_01->canonical == (Type *)0x0) {
                      Type::resolveCanonical(this_01);
                    }
                    if ((this_01->canonical->super_Symbol).kind == TypeRefType) {
                      if (compilation->bitType == (Type *)0x0) break;
                      (expr->super_Expression).type.ptr = compilation->bitType;
                      goto LAB_003aa350;
                    }
                  }
                  bVar1 = false;
                  goto LAB_003aa350;
                }
              }
            }
LAB_003aa2cd:
            if (compilation->bitType == (Type *)0x0) break;
            (expr->super_Expression).type.ptr = compilation->bitType;
            bVar1 = true;
            goto LAB_003aa350;
          }
        }
        if (compilation->bitType == (Type *)0x0) break;
        (expr->super_Expression).type.ptr = compilation->bitType;
        bVar1 = true;
      }
      else {
        if (compilation->bitType == (Type *)0x0) break;
        (expr->super_Expression).type.ptr = compilation->bitType;
        Expression::contextDetermined
                  ((ASTContext *)sourceRange.startLoc,&expr->left_,compilation->stringType,
                   (SourceLocation)0x0);
        Expression::contextDetermined
                  ((ASTContext *)sourceRange.startLoc,&expr->right_,compilation->stringType,
                   (SourceLocation)0x0);
      }
LAB_003aa350:
      bVar2 = bVar1;
      if (bVar3 != false) goto LAB_003aa387;
      Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
      goto LAB_003aa37d;
    }
    if (local_104 - Equality < 2) {
      bVar1 = Type::isFourState((Type *)compilation_00);
      lVar6 = 0x100;
      if (!bVar1) {
        bVar1 = Type::isFourState(this_01);
        lVar6 = (ulong)bVar1 * 8 + 0xf8;
      }
      pTVar10 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar6);
LAB_003a9f10:
      bVar1 = true;
    }
    else {
      if (local_104 - CaseEquality < 2) {
        pTVar10 = compilation->bitType;
        goto LAB_003a9f10;
      }
      bVar2 = Type::isFourState((Type *)compilation_00);
      pTVar10 = compilation->scalarTypeTable[(ulong)bVar2 + 8];
    }
    if (pTVar10 != (Type *)0x0) {
      (expr->super_Expression).type.ptr = pTVar10;
      pTVar10 = Expression::binaryOperatorType
                          (compilation,(Type *)compilation_00,this_01,false,false);
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->left_,pTVar10,(SourceLocation)0x0);
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar10,(SourceLocation)0x0);
      bVar2 = bVar1;
      goto LAB_003aa387;
    }
    break;
  case GreaterThanEqual:
  case GreaterThan:
  case LessThanEqual:
  case LessThan:
    bVar1 = Type::isFourState((Type *)compilation_00);
    lVar6 = 0x100;
    if (!bVar1) {
      bVar1 = Type::isFourState(this_01);
      lVar6 = (ulong)bVar1 * 8 + 0xf8;
    }
    pTVar10 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar6);
    if (pTVar10 != (Type *)0x0) {
      (expr->super_Expression).type.ptr = pTVar10;
      if (bVar3 == true && bVar2 == false) {
        pTVar10 = compilation->stringType;
      }
      else {
        pTVar10 = Expression::binaryOperatorType
                            (compilation,(Type *)compilation_00,this_01,false,false);
      }
      bVar2 = (bool)(bVar2 | bVar3);
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->left_,pTVar10,(SourceLocation)0x0);
LAB_003a9ef1:
      Expression::contextDetermined
                ((ASTContext *)sourceRange.startLoc,&expr->right_,pTVar10,(SourceLocation)0x0);
      goto LAB_003aa387;
    }
    break;
  case LogicalAnd:
  case LogicalOr:
  case LogicalImplication:
  case LogicalEquivalence:
    bVar1 = Type::isFourState((Type *)compilation_00);
    lVar6 = 0x100;
    if (!bVar1) {
      bVar1 = Type::isFourState(this_01);
      lVar6 = (ulong)bVar1 * 8 + 0xf8;
    }
    pTVar10 = *(Type **)((long)&(compilation->super_BumpAllocator).head + lVar6);
    if (pTVar10 != (Type *)0x0) {
      (expr->super_Expression).type.ptr = pTVar10;
      Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->left_);
LAB_003a9d5f:
      Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
      goto LAB_003aa387;
    }
    break;
  case LogicalShiftLeft:
  case LogicalShiftRight:
  case ArithmeticShiftLeft:
  case ArithmeticShiftRight:
    bVar2 = Type::isFourState(this_01);
    if (bVar2) {
      pCVar4 = (Compilation *)
               fromComponents::anon_class_1_0_00000001::operator()
                         ((anon_class_1_0_00000001 *)compilation,compilation_00,forceType);
      if (pCVar4 == (Compilation *)0x0) break;
    }
    else {
      pCVar4 = compilation_00;
      if (compilation_00 == (Compilation *)0x0) {
        pcVar7 = 
        "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *&]"
        ;
        goto LAB_003aa4a9;
      }
    }
    (expr->super_Expression).type.ptr = (Type *)pCVar4;
LAB_003aa37d:
    Expression::selfDetermined((ASTContext *)sourceRange.startLoc,&expr->right_);
    bVar2 = bVar1;
    goto LAB_003aa387;
  case Power:
    if ((compilation_00->options).topModules.
        super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        .entries == (EntryPointer)0x0) {
      Type::resolveCanonical((Type *)compilation_00);
      pTVar10 = extraout_RDX;
    }
    if (*(int *)(compilation_00->options).topModules.
                super_sherwood_v3_table<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<unsigned_long,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::functor_storage<bool,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                .entries != 8) {
      if (this_01->canonical == (Type *)0x0) {
        Type::resolveCanonical(this_01);
        pTVar10 = extraout_RDX_00;
      }
      if ((this_01->canonical->super_Symbol).kind != FloatingType) {
        pTVar10 = fromComponents::anon_class_1_0_00000001::operator()
                            ((anon_class_1_0_00000001 *)compilation,compilation_00,pTVar10);
        if (pTVar10 != (Type *)0x0) {
          (expr->super_Expression).type.ptr = pTVar10;
          goto LAB_003a9d5f;
        }
        break;
      }
    }
    pTVar10 = Expression::binaryOperatorType(compilation,(Type *)compilation_00,this_01,false,false)
    ;
    if (pTVar10 != (Type *)0x0) {
      (expr->super_Expression).type.ptr = pTVar10;
      goto LAB_003a9ef1;
    }
  }
  pcVar7 = 
  "slang::not_null<const slang::ast::Type *>::not_null(U &&) [T = const slang::ast::Type *, U = const slang::ast::Type *]"
  ;
LAB_003aa4a9:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x1b,pcVar7);
}

Assistant:

Expression& BinaryExpression::fromComponents(Expression& lhs, Expression& rhs, BinaryOperator op,
                                             SourceLocation opLoc, SourceRange sourceRange,
                                             const ASTContext& context) {
    auto& compilation = context.getCompilation();
    const Type* lt = lhs.type;
    const Type* rt = rhs.type;

    auto result = compilation.emplace<BinaryExpression>(op, *lt, lhs, rhs, sourceRange);
    if (lhs.bad() || rhs.bad())
        return badExpr(compilation, result);

    if (lt->isUnbounded())
        lt = &compilation.getIntType();
    if (rt->isUnbounded())
        rt = &compilation.getIntType();

    bool bothIntegral = lt->isIntegral() && rt->isIntegral();
    bool bothNumeric = lt->isNumeric() && rt->isNumeric();
    bool bothStrings = lhs.isImplicitString() && rhs.isImplicitString();

    auto forceFourState = [](Compilation& compilation, const Type* forceType) {
        if (forceType->isFloating() || forceType->isFourState())
            return forceType;

        // Use the logic in binaryOperatorType to create a type with the correct size and sign.
        return binaryOperatorType(compilation, forceType, forceType, true);
    };

    auto singleBitType = [](Compilation& compilation, const Type* lt, const Type* rt) {
        if (lt->isFourState() || rt->isFourState())
            return &compilation.getLogicType();
        return &compilation.getBitType();
    };

    bool good;
    switch (op) {
        case BinaryOperator::Add:
        case BinaryOperator::Subtract:
        case BinaryOperator::Multiply:
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::Divide:
            // Result is forced to 4-state because result can be X.
            good = bothNumeric;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::Mod:
            // Result is forced to 4-state because result can be X.
            // Different from divide because only integers are allowed.
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, true);
            break;
        case BinaryOperator::BinaryAnd:
        case BinaryOperator::BinaryOr:
        case BinaryOperator::BinaryXor:
        case BinaryOperator::BinaryXnor:
            good = bothIntegral;
            result->type = binaryOperatorType(compilation, lt, rt, false);
            break;
        case BinaryOperator::LogicalShiftLeft:
        case BinaryOperator::LogicalShiftRight:
        case BinaryOperator::ArithmeticShiftLeft:
        case BinaryOperator::ArithmeticShiftRight:
            // The result is always the same type as the lhs, except that if the rhs is
            // four state then the lhs also becomes four state.
            good = bothIntegral;
            if (rt->isFourState())
                result->type = forceFourState(compilation, lt);
            else
                result->type = lt;
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Power:
            good = bothNumeric;
            if (lt->isFloating() || rt->isFloating()) {
                result->type = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->right_, *result->type);
            }
            else {
                // Result is forced to 4-state because result can be X.
                result->type = forceFourState(compilation, lt);
                selfDetermined(context, result->right_);
            }
            break;
        case BinaryOperator::GreaterThanEqual:
        case BinaryOperator::GreaterThan:
        case BinaryOperator::LessThanEqual:
        case BinaryOperator::LessThan: {
            // Result is always a single bit.
            good = bothNumeric || bothStrings;
            result->type = singleBitType(compilation, lt, rt);

            // Result type is fixed but the two operands affect each other as they would in
            // other context-determined operators.
            auto nt = (good && !bothNumeric) ? &compilation.getStringType()
                                             : binaryOperatorType(compilation, lt, rt, false);
            contextDetermined(context, result->left_, *nt);
            contextDetermined(context, result->right_, *nt);
            break;
        }
        case BinaryOperator::LogicalAnd:
        case BinaryOperator::LogicalOr:
        case BinaryOperator::LogicalImplication:
        case BinaryOperator::LogicalEquivalence:
            // Result is always a single bit.
            good = bothNumeric;
            result->type = singleBitType(compilation, lt, rt);
            selfDetermined(context, result->left_);
            selfDetermined(context, result->right_);
            break;
        case BinaryOperator::Equality:
        case BinaryOperator::Inequality:
        case BinaryOperator::WildcardEquality:
        case BinaryOperator::WildcardInequality:
        case BinaryOperator::CaseEquality:
        case BinaryOperator::CaseInequality:
            // Two types are comparable if:
            // - they are both integral or floating
            // - both classes or null, and assignment compatible
            // - both chandles or null
            // - both aggregates and equivalent
            if (bothNumeric) {
                // For equality and inequality, result is four state if either operand is
                // four state. For case equality and case inequality, result is never four
                // state. For wildcard equality / inequality, result is four state only if
                // lhs is four state.
                if (op == BinaryOperator::Equality || op == BinaryOperator::Inequality) {
                    good = true;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if (op == BinaryOperator::CaseEquality ||
                         op == BinaryOperator::CaseInequality) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = bothIntegral;
                    result->type = lt->isFourState() ? &compilation.getLogicType()
                                                     : &compilation.getBitType();
                }

                // Result type is fixed but the two operands affect each other as they would
                // in other context-determined operators.
                auto nt = binaryOperatorType(compilation, lt, rt, false);
                contextDetermined(context, result->left_, *nt);
                contextDetermined(context, result->right_, *nt);
            }
            else {
                bool isContext = false;
                bool isWildcard = op == BinaryOperator::WildcardEquality ||
                                  op == BinaryOperator::WildcardInequality;

                if (bothStrings) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();

                    // If there is a literal involved, make sure it's converted to string.
                    isContext = true;
                    contextDetermined(context, result->left_, compilation.getStringType());
                    contextDetermined(context, result->right_, compilation.getStringType());
                }
                else if (lt->isAggregate() && lt->isEquivalent(*rt) && !lt->isUnpackedUnion()) {
                    good = !isWildcard;
                    result->type = singleBitType(compilation, lt, rt);
                }
                else if ((lt->isClass() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isClass() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCHandle() || lt->isNull()) && (rt->isCHandle() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isEvent() || lt->isNull()) && (rt->isEvent() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isCovergroup() || lt->isNull()) &&
                         (rt->isCovergroup() || rt->isNull())) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if ((lt->isVirtualInterface() && lt->isAssignmentCompatible(*rt)) ||
                         (rt->isVirtualInterface() && rt->isAssignmentCompatible(*lt))) {
                    good = true;
                    result->type = &compilation.getBitType();
                }
                else if (lt->isTypeRefType() && rt->isTypeRefType()) {
                    good = !isWildcard;
                    result->type = &compilation.getBitType();
                }
                else {
                    good = false;
                }

                if (!isContext) {
                    selfDetermined(context, result->left_);
                    selfDetermined(context, result->right_);
                }
            }
            break;
        default:
            ASSUME_UNREACHABLE;
    }

    if (!good) {
        auto& diag = context.addDiag(diag::BadBinaryExpression, opLoc);
        diag << *lt << *rt;
        diag << lhs.sourceRange;
        diag << rhs.sourceRange;
        return badExpr(compilation, result);
    }

    return *result;
}